

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O2

void __thiscall DBaseDecal::Serialize(DBaseDecal *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = FSerializer::operator()(arc,"wallprev",&this->WallPrev);
  pFVar1 = FSerializer::operator()(pFVar1,"wallnext",&this->WallNext);
  pFVar1 = FSerializer::operator()(pFVar1,"leftdistance",&this->LeftDistance);
  pFVar1 = FSerializer::operator()(pFVar1,"z",&this->Z);
  pFVar1 = FSerializer::operator()(pFVar1,"scalex",&this->ScaleX);
  pFVar1 = FSerializer::operator()(pFVar1,"scaley",&this->ScaleY);
  pFVar1 = FSerializer::operator()(pFVar1,"alpha",&this->Alpha);
  pFVar1 = FSerializer::operator()(pFVar1,"alphacolor",&this->AlphaColor);
  pFVar1 = FSerializer::operator()(pFVar1,"translation",&this->Translation);
  pFVar1 = FSerializer::operator()(pFVar1,"picnum",&this->PicNum);
  pFVar1 = FSerializer::operator()(pFVar1,"renderflags",&this->RenderFlags);
  pFVar1 = FSerializer::operator()(pFVar1,"renderstyle",&this->RenderStyle);
  pFVar1 = FSerializer::operator()(pFVar1,"side",&this->Side);
  FSerializer::operator()(pFVar1,"sector",(sector_t **)&this->Sector);
  return;
}

Assistant:

void DBaseDecal::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("wallprev", WallPrev)
		("wallnext", WallNext)
		("leftdistance", LeftDistance)
		("z", Z)
		("scalex", ScaleX)
		("scaley", ScaleY)
		("alpha", Alpha)
		("alphacolor", AlphaColor)
		("translation", Translation)
		("picnum", PicNum)
		("renderflags", RenderFlags)
		("renderstyle", RenderStyle)
		("side", Side)
		("sector", Sector);
}